

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  undefined8 *puVar1;
  double dVar2;
  result_type rVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  clock_t cVar7;
  ulong uVar8;
  long *plVar9;
  ostream *poVar10;
  ulong uVar11;
  double *pdVar12;
  uint uVar13;
  long lVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> observations;
  LandmarkObs obs;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> noisy_observations;
  vector<control_s,_std::allocator<control_s>_> position_meas;
  vector<ground_truth,_std::allocator<ground_truth>_> gt;
  double sigma_pos [3];
  double cum_mean_error [3];
  Map map;
  double sigma_landmark [2];
  default_random_engine gen;
  vector<Particle,_std::allocator<Particle>_> particles;
  ParticleFilter pf;
  double total_error [3];
  normal_distribution<double> N_obs_y;
  normal_distribution<double> N_obs_x;
  normal_distribution<double> N_theta_init;
  normal_distribution<double> N_y_init;
  normal_distribution<double> N_x_init;
  ostringstream file;
  undefined1 auStack_4e8 [8];
  result_type local_4e0;
  ulong local_4d8;
  int local_4cc;
  result_type local_4c8;
  ulong local_4c0;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> local_4b8;
  LandmarkObs local_498;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> local_478;
  double local_460;
  vector<control_s,_std::allocator<control_s>_> local_458;
  vector<ground_truth,_std::allocator<ground_truth>_> local_438;
  double local_418 [4];
  double local_3f8 [4];
  Map local_3d8;
  double local_3b8 [3];
  clock_t local_3a0;
  long local_398;
  ulong local_390;
  double local_388;
  double local_380;
  double local_378;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_370;
  vector<Particle,_std::allocator<Particle>_> local_368;
  ParticleFilter local_350;
  string local_318;
  double local_2f8 [4];
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> local_2d8;
  string local_2c0;
  string local_2a0;
  string local_280;
  normal_distribution<double> local_260;
  normal_distribution<double> local_240;
  normal_distribution<double> local_220;
  normal_distribution<double> local_200;
  normal_distribution<double> local_1e0;
  Map local_1c0;
  long local_1a8 [2];
  undefined8 auStack_198 [12];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  cVar7 = clock();
  local_418[0] = 0.3;
  local_418[1] = 0.3;
  local_418[2] = 0.01;
  local_3b8[0] = 0.3;
  local_3b8[1] = 0.3;
  local_370._M_x = 1;
  local_1e0._M_param._M_mean = 0.0;
  local_1e0._M_param._M_stddev = 0.3;
  local_1e0._M_saved = 0.0;
  local_1e0._M_saved_available = false;
  local_200._M_param._M_mean = 0.0;
  local_200._M_param._M_stddev = 0.3;
  local_200._M_saved = 0.0;
  local_200._M_saved_available = false;
  local_220._M_param._M_mean = 0.0;
  local_220._M_param._M_stddev = 0.01;
  local_220._M_saved = 0.0;
  local_220._M_saved_available = false;
  local_240._M_param._M_mean = 0.0;
  local_240._M_param._M_stddev = 0.3;
  local_240._M_saved = 0.0;
  local_240._M_saved_available = false;
  local_260._M_param._M_mean = 0.0;
  local_260._M_param._M_stddev = 0.3;
  local_260._M_saved = 0.0;
  local_260._M_saved_available = false;
  local_3d8.landmark_list.
  super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3d8.landmark_list.
  super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3d8.landmark_list.
  super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"data/map_data.txt","");
  bVar4 = read_map_data(&local_280,&local_3d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if (!bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error: Could not open map file",0x1e);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    iVar6 = -1;
    std::ostream::flush();
    goto LAB_001043eb;
  }
  local_458.super__Vector_base<control_s,_std::allocator<control_s>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_458.super__Vector_base<control_s,_std::allocator<control_s>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_458.super__Vector_base<control_s,_std::allocator<control_s>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"data/control_data.txt","");
  bVar4 = read_control_data(&local_2a0,&local_458);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
  if (bVar4) {
    local_438.super__Vector_base<ground_truth,_std::allocator<ground_truth>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_438.super__Vector_base<ground_truth,_std::allocator<ground_truth>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_438.super__Vector_base<ground_truth,_std::allocator<ground_truth>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"data/gt_data.txt","");
    bVar4 = read_gt_data(&local_2c0,&local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p);
    }
    if (bVar4) {
      uVar8 = (ulong)((long)local_458.super__Vector_base<control_s,_std::allocator<control_s>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_458.super__Vector_base<control_s,_std::allocator<control_s>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 4;
      local_350.num_particles = 0;
      local_350.is_initialized = false;
      local_350.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_350.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_350.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_350.particles.super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_350.particles.super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_350.particles.super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2f8[2] = 0.0;
      local_2f8[0] = 0.0;
      local_2f8[1] = 0.0;
      local_4c0 = 0;
      local_3f8[2] = 0.0;
      local_3f8[0] = 0.0;
      local_3f8[1] = 0.0;
      iVar6 = (int)uVar8;
      local_398 = (long)iVar6;
      local_390 = 0;
      if (0 < iVar6) {
        local_390 = uVar8 & 0xffffffff;
      }
      local_4cc = 0;
      local_3a0 = cVar7;
      do {
        local_4d8 = local_4c0;
        if (local_4c0 == local_390) break;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Time step: ",0xb);
        plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)local_4d8);
        std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
        std::ostream::put((char)plVar9);
        std::ostream::flush();
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"data/observation/observations_",0x1e);
        lVar14 = *(long *)(local_1a8[0] + -0x18);
        if (acStack_c8[lVar14 + 1] == '\0') {
          cVar5 = std::ios::widen((char)auStack_4e8 + (char)lVar14 + '@');
          acStack_c8[lVar14] = cVar5;
          acStack_c8[lVar14 + 1] = '\x01';
        }
        acStack_c8[lVar14] = '0';
        *(undefined8 *)((long)auStack_198 + *(long *)(local_1a8[0] + -0x18)) = 6;
        local_4c0 = local_4d8 + 1;
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)local_4c0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,".txt",4);
        local_4b8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_4b8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_4b8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::stringbuf::str();
        bVar4 = read_landmark_data(&local_318,&local_4b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p);
        }
        if (bVar4) {
          if (local_350.is_initialized == false) {
            local_4e0 = std::normal_distribution<double>::operator()
                                  (&local_1e0,&local_370,&local_1e0._M_param);
            local_4c8 = std::normal_distribution<double>::operator()
                                  (&local_200,&local_370,&local_200._M_param);
            std::normal_distribution<double>::operator()(&local_220,&local_370,&local_220._M_param);
            ParticleFilter::init(&local_350,(EVP_PKEY_CTX *)local_418);
          }
          else {
            ParticleFilter::prediction
                      (&local_350,0.1,local_418,
                       local_458.super__Vector_base<control_s,_std::allocator<control_s>_>._M_impl.
                       super__Vector_impl_data._M_start[local_4d8 - 1].velocity,
                       local_458.super__Vector_base<control_s,_std::allocator<control_s>_>._M_impl.
                       super__Vector_impl_data._M_start[local_4d8 - 1].yawrate);
          }
          local_478.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_478.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
          super__Vector_impl_data._M_finish = (LandmarkObs *)0x0;
          local_478.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (LandmarkObs *)0x0;
          if (local_4b8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_4b8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
              super__Vector_impl_data._M_start) {
            lVar14 = 0;
            uVar8 = 0;
            do {
              local_4e0 = std::normal_distribution<double>::operator()
                                    (&local_240,&local_370,&local_240._M_param);
              rVar3 = std::normal_distribution<double>::operator()
                                (&local_260,&local_370,&local_260._M_param);
              puVar1 = (undefined8 *)
                       ((long)&(local_4b8.
                                super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>.
                                _M_impl.super__Vector_impl_data._M_start)->id + lVar14);
              local_498._0_8_ = *puVar1;
              local_498.x = local_4e0 + (double)puVar1[1];
              local_498.y = rVar3 + *(double *)
                                     ((long)&(local_4b8.
                                              super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->y + lVar14
                                     );
              if (local_478.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_478.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<LandmarkObs,std::allocator<LandmarkObs>>::
                _M_realloc_insert<LandmarkObs_const&>
                          ((vector<LandmarkObs,std::allocator<LandmarkObs>> *)&local_478,
                           (iterator)
                           local_478.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>.
                           _M_impl.super__Vector_impl_data._M_finish,&local_498);
              }
              else {
                (local_478.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                 super__Vector_impl_data._M_finish)->y = local_498.y;
                (local_478.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                 super__Vector_impl_data._M_finish)->id = local_498.id;
                *(int *)&(local_478.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->field_0x4 = local_498._4_4_;
                (local_478.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                 super__Vector_impl_data._M_finish)->x = local_498.x;
                local_478.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_478.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl
                     .super__Vector_impl_data._M_finish + 1;
              }
              uVar8 = uVar8 + 1;
              uVar11 = ((long)local_4b8.
                              super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_4b8.
                              super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
              lVar14 = lVar14 + 0x18;
            } while (uVar8 <= uVar11 && uVar11 - uVar8 != 0);
          }
          std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::vector(&local_2d8,&local_478);
          std::vector<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>::vector
                    (&local_1c0.landmark_list,&local_3d8.landmark_list);
          ParticleFilter::updateWeights(&local_350,50.0,local_3b8,&local_2d8,&local_1c0);
          if (local_1c0.landmark_list.
              super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1c0.landmark_list.
                            super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_2d8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2d8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          ParticleFilter::resample(&local_350);
          std::vector<Particle,_std::allocator<Particle>_>::vector(&local_368,&local_350.particles);
          uVar13 = (int)((long)local_368.super__Vector_base<Particle,_std::allocator<Particle>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_368.super__Vector_base<Particle,_std::allocator<Particle>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3) * -0x33333333;
          if (0 < (int)uVar13) {
            uVar8 = (ulong)(uVar13 & 0x7fffffff);
            pdVar12 = &(local_368.super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
                        super__Vector_impl_data._M_start)->weight;
            uVar15 = 0;
            uVar16 = 0;
            do {
              dVar2 = *pdVar12;
              if ((double)CONCAT44(uVar16,uVar15) <= dVar2 &&
                  dVar2 != (double)CONCAT44(uVar16,uVar15)) {
                local_388 = pdVar12[-3];
                local_380 = pdVar12[-2];
                local_378 = pdVar12[-1];
                uVar15 = SUB84(dVar2,0);
                uVar16 = (int)((ulong)dVar2 >> 0x20);
              }
              pdVar12 = pdVar12 + 5;
              uVar8 = uVar8 - 1;
            } while (uVar8 != 0);
          }
          dVar2 = ABS(local_380 -
                      local_438.super__Vector_base<ground_truth,_std::allocator<ground_truth>_>.
                      _M_impl.super__Vector_impl_data._M_start[local_4d8].y);
          unique0x10000c56 = SUB84(dVar2,0);
          getError(double,double,double,double,double,double)::error =
               ABS(local_388 -
                   local_438.super__Vector_base<ground_truth,_std::allocator<ground_truth>_>._M_impl
                   .super__Vector_impl_data._M_start[local_4d8].x);
          unique0x10000c5a = (int)((ulong)dVar2 >> 0x20);
          dVar2 = fmod(ABS(local_378 -
                           local_438.super__Vector_base<ground_truth,_std::allocator<ground_truth>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_4d8].theta),
                       6.283185307179586);
          _DAT_0010a1d0 =
               ~-(ulong)(3.141592653589793 < dVar2) & (ulong)dVar2 |
               (ulong)(6.283185307179586 - dVar2) & -(ulong)(3.141592653589793 < dVar2);
          lVar14 = 0;
          do {
            dVar2 = *(double *)
                     ((long)&getError(double,double,double,double,double,double)::error + lVar14) +
                    *(double *)((long)local_2f8 + lVar14);
            *(double *)((long)local_2f8 + lVar14) = dVar2;
            *(double *)((long)local_3f8 + lVar14) = dVar2 / (double)(int)local_4c0;
            lVar14 = lVar14 + 8;
          } while (lVar14 != 0x18);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Cumulative mean weighted error: x ",0x22);
          local_4e0 = local_3f8[0];
          poVar10 = std::ostream::_M_insert<double>(local_3f8[0]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," y ",3);
          local_4c8 = local_3f8[1];
          poVar10 = std::ostream::_M_insert<double>(local_3f8[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," yaw ",5);
          local_460 = local_3f8[2];
          poVar10 = std::ostream::_M_insert<double>(local_3f8[2]);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          bVar4 = true;
          if ((99 < local_4d8) && (((1.0 < local_4e0 || (1.0 < local_4c8)) || (0.05 < local_460))))
          {
            if (local_4e0 <= 1.0) {
              if (local_4c8 <= 1.0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Your yaw error, ",0x10);
                poVar10 = std::ostream::_M_insert<double>(local_460);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10," is larger than the maximum allowable error, ",0x2d);
                poVar10 = std::ostream::_M_insert<double>(0.05);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Your y error, ",0xe);
                poVar10 = std::ostream::_M_insert<double>(local_4c8);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10," is larger than the maximum allowable error, ",0x2d);
                poVar10 = std::ostream::_M_insert<double>(1.0);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Your x error, ",0xe);
              poVar10 = std::ostream::_M_insert<double>(local_4e0);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10," is larger than the maximum allowable error, ",0x2d);
              poVar10 = std::ostream::_M_insert<double>(1.0);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
            }
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            local_4cc = -1;
            bVar4 = false;
          }
          if (local_368.super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_368.super__Vector_base<Particle,_std::allocator<Particle>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_478.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_478.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Error: Could not open observation file ",0x27);
          plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)local_4c0);
          std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
          std::ostream::put((char)plVar9);
          std::ostream::flush();
          local_4cc = -1;
          bVar4 = false;
        }
        if (local_4b8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_4b8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      } while (bVar4);
      iVar6 = local_4cc;
      if (local_398 <= (long)local_4d8) {
        cVar7 = clock();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Runtime (sec): ",0xf);
        local_4e0 = (double)((int)cVar7 - (int)local_3a0) / 1000000.0;
        poVar10 = std::ostream::_M_insert<double>(local_4e0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        if ((45.0 <= local_4e0) || (local_350.is_initialized != true)) {
          if (local_350.is_initialized != false) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Your runtime ",0xd);
            poVar10 = std::ostream::_M_insert<double>(local_4e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10," is larger than the maximum allowable runtime, ",0x2f);
            poVar10 = std::ostream::_M_insert<double>(45.0);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
            std::ostream::put((char)poVar10);
            iVar6 = -1;
            std::ostream::flush();
            goto LAB_001043ba;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "This is the starter code. You haven\'t initialized your filter.",0x3e);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
          std::ostream::put('\0');
          std::ostream::flush();
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Success! Your particle filter passed!",0x25);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
        iVar6 = 0;
      }
LAB_001043ba:
      ParticleFilter::~ParticleFilter(&local_350);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error: Could not open ground truth data file",0x2c);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
      std::ostream::put('\0');
      iVar6 = -1;
      std::ostream::flush();
    }
    if (local_438.super__Vector_base<ground_truth,_std::allocator<ground_truth>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_438.super__Vector_base<ground_truth,_std::allocator<ground_truth>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error: Could not open position/control measurement file",0x37)
    ;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    iVar6 = -1;
    std::ostream::flush();
  }
  if (local_458.super__Vector_base<control_s,_std::allocator<control_s>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_458.super__Vector_base<control_s,_std::allocator<control_s>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_001043eb:
  if (local_3d8.landmark_list.
      super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3d8.landmark_list.
                    super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar6;
}

Assistant:

int main() {
	
	// parameters related to grading.
	int time_steps_before_lock_required = 100; // number of time steps before accuracy is checked by grader.
	double max_runtime = 45; // Max allowable runtime to pass [sec]
	double max_translation_error = 1; // Max allowable translation error to pass [m]
	double max_yaw_error = 0.05; // Max allowable yaw error [rad]



	// Start timer.
	int start = clock();
	
	//Set up parameters here
	double delta_t = 0.1; // Time elapsed between measurements [sec]
	double sensor_range = 50; // Sensor range [m]
	
	/*
	 * Sigmas - just an estimate, usually comes from uncertainty of sensor, but
	 * if you used fused data from multiple sensors, it's difficult to find
	 * these uncertainties directly.
	 */
	double sigma_pos [3] = {0.3, 0.3, 0.01}; // GPS measurement uncertainty [x [m], y [m], theta [rad]]
	double sigma_landmark [2] = {0.3, 0.3}; // Landmark measurement uncertainty [x [m], y [m]]

	// noise generation
	default_random_engine gen;
	normal_distribution<double> N_x_init(0, sigma_pos[0]);
	normal_distribution<double> N_y_init(0, sigma_pos[1]);
	normal_distribution<double> N_theta_init(0, sigma_pos[2]);
	normal_distribution<double> N_obs_x(0, sigma_landmark[0]);
	normal_distribution<double> N_obs_y(0, sigma_landmark[1]);
	double n_x, n_y, n_theta, n_range, n_heading;
	// Read map data
	Map map;
	if (!read_map_data("data/map_data.txt", map)) {
		cout << "Error: Could not open map file" << endl;
		return -1;
	}

	// Read position data
	vector<control_s> position_meas;
	if (!read_control_data("data/control_data.txt", position_meas)) {
		cout << "Error: Could not open position/control measurement file" << endl;
		return -1;
	}
	
	// Read ground truth data
	vector<ground_truth> gt;
	if (!read_gt_data("data/gt_data.txt", gt)) {
		cout << "Error: Could not open ground truth data file" << endl;
		return -1;
	}
	
	// Run particle filter!
	int num_time_steps = position_meas.size();
	ParticleFilter pf;
	double total_error[3] = {0,0,0};
	double cum_mean_error[3] = {0,0,0};
	
	for (int i = 0; i < num_time_steps; ++i) {
		cout << "Time step: " << i << endl;
		// Read in landmark observations for current time step.
		ostringstream file;
		file << "data/observation/observations_" << setfill('0') << setw(6) << i+1 << ".txt";
		vector<LandmarkObs> observations;
		if (!read_landmark_data(file.str(), observations)) {
			cout << "Error: Could not open observation file " << i+1 << endl;
			return -1;
		}
		
		// Initialize particle filter if this is the first time step.
		if (!pf.initialized()) {
			n_x = N_x_init(gen);
			n_y = N_y_init(gen);
			n_theta = N_theta_init(gen);
			pf.init(gt[i].x + n_x, gt[i].y + n_y, gt[i].theta + n_theta, sigma_pos);
		}
		else {
			// Predict the vehicle's next state (noiseless).
			pf.prediction(delta_t, sigma_pos, position_meas[i-1].velocity, position_meas[i-1].yawrate);
		}
		// simulate the addition of noise to noiseless observation data.
		vector<LandmarkObs> noisy_observations;
		LandmarkObs obs;
		for (int j = 0; j < observations.size(); ++j) {
			n_x = N_obs_x(gen);
			n_y = N_obs_y(gen);
			obs = observations[j];
			obs.x = obs.x + n_x;
			obs.y = obs.y + n_y;
			noisy_observations.push_back(obs);
		}

		// Update the weights and resample
		pf.updateWeights(sensor_range, sigma_landmark, noisy_observations, map);
		pf.resample();
		
		// Calculate and output the average weighted error of the particle filter over all time steps so far.
		vector<Particle> particles = pf.particles;
		int num_particles = particles.size();
		double highest_weight = 0.0;
		Particle best_particle;
		for (int i = 0; i < num_particles; ++i) {
			if (particles[i].weight > highest_weight) {
				highest_weight = particles[i].weight;
				best_particle = particles[i];
			}
		}
		double *avg_error = getError(gt[i].x, gt[i].y, gt[i].theta, best_particle.x, best_particle.y, best_particle.theta);

		for (int j = 0; j < 3; ++j) {
			total_error[j] += avg_error[j];
			cum_mean_error[j] = total_error[j] / (double)(i + 1);
		}
		
		// Print the cumulative weighted error
		cout << "Cumulative mean weighted error: x " << cum_mean_error[0] << " y " << cum_mean_error[1] << " yaw " << cum_mean_error[2] << endl;
		
		// If the error is too high, say so and then exit.
		if (i >= time_steps_before_lock_required) {
			if (cum_mean_error[0] > max_translation_error || cum_mean_error[1] > max_translation_error || cum_mean_error[2] > max_yaw_error) {
				if (cum_mean_error[0] > max_translation_error) {
					cout << "Your x error, " << cum_mean_error[0] << " is larger than the maximum allowable error, " << max_translation_error << endl;
				}
				else if (cum_mean_error[1] > max_translation_error) {
					cout << "Your y error, " << cum_mean_error[1] << " is larger than the maximum allowable error, " << max_translation_error << endl;
				}
				else {
					cout << "Your yaw error, " << cum_mean_error[2] << " is larger than the maximum allowable error, " << max_yaw_error << endl;
				}
				return -1;
			}
		}
	}
	
	// Output the runtime for the filter.
	int stop = clock();
	double runtime = (stop - start) / double(CLOCKS_PER_SEC);
	cout << "Runtime (sec): " << runtime << endl;
	
	// Print success if accuracy and runtime are sufficient (and this isn't just the starter code).
	if (runtime < max_runtime && pf.initialized()) {
		cout << "Success! Your particle filter passed!" << endl;
	}
	else if (!pf.initialized()) {
		cout << "This is the starter code. You haven't initialized your filter." << endl;
	}
	else {
		cout << "Your runtime " << runtime << " is larger than the maximum allowable runtime, " << max_runtime << endl;
		return -1;
	}
	
	return 0;
}